

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O0

void hyperplane_dimension_order(double *angle_values,int *dims,int ndims,int *dimension_order)

{
  long in_RCX;
  int in_EDX;
  int *in_RDI;
  int *unaff_retaddr;
  anon_class_16_2_46888436 in_stack_00000008;
  int i;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    *(int *)(in_RCX + (long)local_24 * 4) = local_24;
  }
  std::sort<int*,hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>
            (unaff_retaddr,in_RDI,in_stack_00000008);
  return;
}

Assistant:

void hyperplane_dimension_order(const double angle_values[],
				const int dims[],
				const int ndims,
				int dimension_order[]) {
  //O(n)
  for (int i = 0; i < ndims; i++) {
	dimension_order[i] = i;
  }

  // O ( ndims log (ndims) )
  //Sort the dimension_order vector based on the values in angle_values
  std::sort(&dimension_order[0], &dimension_order[0] + ndims,
			[&](const int &j, const int &k) {
			  if (angle_values[j] == angle_values[k])
				return dims[j] > dims[k];
			  else
				return angle_values[j] < angle_values[k];
			}
  );
}